

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  char cVar5;
  int iVar6;
  result rVar7;
  long lVar8;
  ulong uVar9;
  decimal_fp<float> dVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint64_t error;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  decimal_fp<double> dVar18;
  fixed_handler handler;
  uint local_74;
  fixed_handler local_70;
  buffer<char> *local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  uint64_t local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar12 = (ulong)specs & 0xff00000000;
  local_70.fixed = uVar12 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar12 != 0x200000000) {
      sVar17 = buf->size_;
      uVar12 = sVar17 + 1;
      if (buf->capacity_ < uVar12) {
        (**buf->_vptr_buffer)(buf);
        sVar17 = buf->size_;
        uVar12 = sVar17 + 1;
      }
      buf->size_ = uVar12;
      local_74 = 0;
      buf->ptr_[sVar17] = '0';
    }
    else {
      uVar12 = buf->capacity_;
      uVar11 = (ulong)(uint)precision;
      if (uVar12 < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
        uVar12 = buf->capacity_;
      }
      if (uVar11 <= uVar12) {
        uVar12 = uVar11;
      }
      buf->size_ = uVar12;
      memset(buf->ptr_,0x30,uVar11);
      local_74 = -precision;
    }
  }
  else {
    local_50 = (ulong)specs >> 0x20;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar6 = snprintf_float<double>(value,precision,specs,buf);
      return iVar6;
    }
    if (precision < 0) {
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        dVar18 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar18.significand);
        local_74 = dVar18.exponent;
      }
      else {
        dVar10 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar10.significand);
        local_74 = dVar10.exponent;
      }
    }
    else {
      uVar11 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        iVar6 = -0x427 - (int)LZCOUNT(uVar11);
        uVar11 = uVar11 << ((ulong)(byte)((char)LZCOUNT(uVar11) + 0x35) & 0x3f);
      }
      else {
        uVar11 = uVar11 | 0x10000000000000;
        iVar6 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar4 = (int)((ulong)((long)(-0x32 - iVar6) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar13 = iVar4 + 0x15b;
      uVar14 = iVar4 + 0x162;
      if (-1 < (int)uVar13) {
        uVar14 = uVar13;
      }
      local_48 = (ulong)(uVar14 & 0xfffffff8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar11 << 0xb;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(basic_data<void>::grisu_pow10_significands +
                               (long)((int)uVar14 >> 3) * 8 + 8);
      uVar11 = (ulong)(-(*(short *)(basic_data<void>::grisu_pow10_exponents +
                                   (long)((int)uVar14 >> 3) * 2 + 2) + iVar6) - 0x35);
      uVar16 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
      local_70.buf = buf->ptr_;
      local_70.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        local_70.precision = precision;
      }
      uVar15 = uVar16 >> (uVar11 & 0x3f);
      local_70.size = 0;
      local_70.exp10 = 0x154 - (uVar14 & 0xfffffff8);
      uVar14 = (uint)uVar15;
      if (uVar14 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      local_40 = value;
      if (uVar15 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      lVar8 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)(LZCOUNT(uVar14 | 1) ^ 0x1f) * 2) -
              (ulong)(uVar14 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)*(ushort *)
                                                (bsr2log10(int)::data +
                                                (ulong)(LZCOUNT(uVar14 | 1) ^ 0x1f) * 2) * 4));
      local_74 = (uint)lVar8;
      rVar7 = fixed_handler::on_start
                        (&local_70,
                         *(long *)(basic_data<void>::grisu_pow10_exponents + lVar8 * 8 + 0xa8) <<
                         (uVar11 & 0x3f),uVar16 / 10,10,(int *)&local_74);
      if (rVar7 == more) {
        local_38 = 1L << (uVar11 & 0x3f);
        uVar1 = local_38 - 1;
        uVar16 = uVar16 & uVar1;
        local_58 = buf;
        do {
          uVar14 = local_74 - 1;
          switch((ulong)uVar14) {
          case 0:
            cVar5 = (char)uVar15;
            uVar15 = 0;
            goto LAB_00129e58;
          case 1:
            cVar5 = (char)((uVar15 & 0xffffffff) / 10);
            iVar6 = (int)((uVar15 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar5 = (char)((uVar15 & 0xffffffff) / 100);
            iVar6 = (int)((uVar15 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar5 = (char)((uVar15 & 0xffffffff) / 1000);
            iVar6 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar5 = (char)((uVar15 & 0xffffffff) / 10000);
            iVar6 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar9 = uVar15 >> 5 & 0x7ffffff;
            cVar5 = (char)(uVar9 / 0xc35);
            iVar6 = (int)(uVar9 / 0xc35) * 100000;
            break;
          case 6:
            cVar5 = (char)((uVar15 & 0xffffffff) / 1000000);
            iVar6 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar5 = (char)((uVar15 & 0xffffffff) / 10000000);
            iVar6 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar5 = (char)((uVar15 & 0xffffffff) / 100000000);
            iVar6 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar9 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
            cVar5 = (char)(uVar9 >> 0x27);
            iVar6 = (uint)(uVar9 >> 0x27) * 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          uVar15 = (ulong)(uint)((int)uVar15 - iVar6);
LAB_00129e58:
          local_74 = uVar14;
          rVar7 = fixed_handler::on_digit
                            (&local_70,cVar5 + '0',
                             *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar14 * 8) <<
                             (uVar11 & 0x3f),(uVar15 << (uVar11 & 0x3f)) + uVar16,1,uVar14,true);
          buf = local_58;
          if (rVar7 != more) goto LAB_00129eff;
        } while (0 < (int)local_74);
        error = 1;
        do {
          uVar15 = uVar16 * 10;
          error = error * 10;
          uVar16 = uVar15 & uVar1;
          local_74 = local_74 - 1;
          rVar7 = fixed_handler::on_digit
                            (&local_70,(char)(uVar15 >> (uVar11 & 0x3f)) + '0',local_38,uVar16,error
                             ,local_74,false);
          buf = local_58;
        } while (rVar7 == more);
      }
LAB_00129eff:
      if (rVar7 == error) {
        local_74 = (local_70.size - ((int)local_48 + 8)) + 0x15b + local_74;
        uVar14 = (uint)local_50;
        fallback_format<double>
                  (local_40,local_70.precision,(bool)((byte)(uVar14 >> 0x12) & 1),buf,
                   (int *)&local_74);
      }
      else {
        local_74 = local_74 + local_70.exp10;
        uVar11 = (ulong)local_70.size;
        if ((long)uVar11 < 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        uVar16 = buf->capacity_;
        if (uVar16 < uVar11) {
          (**buf->_vptr_buffer)(buf,uVar11);
          uVar16 = buf->capacity_;
        }
        uVar14 = (uint)local_50;
        if (uVar16 < uVar11) {
          uVar11 = uVar16;
        }
        buf->size_ = uVar11;
      }
      if ((uVar14 >> 0x14 & 1) == 0 && uVar12 != 0x200000000) {
        sVar17 = buf->size_;
        if (sVar17 != 0) {
          do {
            uVar14 = local_74 + 1;
            if (buf->ptr_[sVar17 - 1] != '0') {
              uVar12 = buf->capacity_;
              if (uVar12 < sVar17) {
                (**buf->_vptr_buffer)(buf,sVar17);
                uVar12 = buf->capacity_;
              }
              goto LAB_00129fe4;
            }
            sVar17 = sVar17 - 1;
            local_74 = uVar14;
          } while (sVar17 != 0);
        }
        uVar12 = buf->capacity_;
        sVar17 = 0;
LAB_00129fe4:
        if (uVar12 < sVar17) {
          sVar17 = uVar12;
        }
        buf->size_ = sVar17;
      }
    }
  }
  return local_74;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}